

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O0

void __thiscall
CRegexParser::build_group
          (CRegexParser *this,re_machine *new_machine,re_machine *sub_machine,int group_id)

{
  wchar_t in_ECX;
  re_state_id *in_RDX;
  re_state_id *in_RSI;
  CRegexParser *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  init_machine((CRegexParser *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(re_machine *)in_RDI);
  set_trans(in_RDI,*in_RSI,*in_RDX,RE_GROUP_ENTER,in_ECX);
  set_trans(in_RDI,in_RDX[1],in_RSI[1],RE_GROUP_EXIT,in_ECX);
  return;
}

Assistant:

void CRegexParser::build_group(re_machine *new_machine,
                               re_machine *sub_machine, int group_id)
{
    /* initialize the container machine */
    init_machine(new_machine);

    /* 
     *   Set up a group-entry transition from the new machine's initial
     *   state into the initial state of the group, and a group-exit
     *   transition from the group's final state into the container's final
     *   state.  For both transitions, store the group ID in the character
     *   field of the transition, to identify which group is affected.  
     */
    set_trans(new_machine->init, sub_machine->init,
              RE_GROUP_ENTER, (wchar_t)group_id);
    set_trans(sub_machine->final, new_machine->final,
              RE_GROUP_EXIT, (wchar_t)group_id);
}